

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O0

LispPTR N_OP_fgreaterp(LispPTR parg1,LispPTR parg2)

{
  ushort uVar1;
  float *pfVar2;
  LispPTR *pLVar3;
  float local_1c;
  float local_18;
  float arg2;
  float arg1;
  LispPTR parg2_local;
  LispPTR parg1_local;
  
  if ((parg1 & 0xfff0000) == 0xe0000) {
    local_18 = (float)(parg1 & 0xffff);
  }
  else if ((parg1 & 0xfff0000) == 0xf0000) {
    local_18 = (float)(int)(parg1 | 0xffff0000);
  }
  else {
    uVar1 = *(ushort *)((ulong)(MDStypetbl + (parg1 >> 9)) ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(parg1);
      local_18 = (float)(int)*pLVar3;
    }
    else {
      if (uVar1 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar2 = (float *)NativeAligned4FromLAddr(parg1);
      local_18 = *pfVar2;
    }
  }
  if ((parg2 & 0xfff0000) == 0xe0000) {
    local_1c = (float)(parg2 & 0xffff);
  }
  else if ((parg2 & 0xfff0000) == 0xf0000) {
    local_1c = (float)(int)(parg2 | 0xffff0000);
  }
  else {
    uVar1 = *(ushort *)((ulong)(MDStypetbl + (parg2 >> 9)) ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(parg2);
      local_1c = (float)(int)*pLVar3;
    }
    else {
      if (uVar1 != 3) {
        MachineState.tosvalue = parg2;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar2 = (float *)NativeAligned4FromLAddr(parg2);
      local_1c = *pfVar2;
    }
  }
  if (local_18 <= local_1c) {
    parg2_local = 0;
  }
  else {
    parg2_local = 0x4c;
  }
  return parg2_local;
}

Assistant:

LispPTR N_OP_fgreaterp(LispPTR parg1, LispPTR parg2) {
  float arg1, arg2;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);
}